

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_rect.cpp
# Opt level: O1

void __thiscall CUIRect::HSplitTop(CUIRect *this,float Cut,CUIRect *pTop,CUIRect *pBottom)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  uVar3 = this->x;
  uVar4 = this->y;
  fVar1 = this->w;
  fVar2 = this->h;
  if (pTop != (CUIRect *)0x0) {
    pTop->x = (float)uVar3;
    pTop->y = (float)uVar4;
    pTop->w = fVar1;
    pTop->h = Cut;
  }
  if (pBottom != (CUIRect *)0x0) {
    pBottom->x = (float)uVar3;
    pBottom->y = (float)uVar4 + Cut;
    pBottom->w = fVar1;
    pBottom->h = fVar2 - Cut;
  }
  return;
}

Assistant:

void CUIRect::HSplitTop(float Cut, CUIRect *pTop, CUIRect *pBottom) const
{
	CUIRect r = *this;

	if(pTop)
	{
		pTop->x = r.x;
		pTop->y = r.y;
		pTop->w = r.w;
		pTop->h = Cut;
	}

	if(pBottom)
	{
		pBottom->x = r.x;
		pBottom->y = r.y + Cut;
		pBottom->w = r.w;
		pBottom->h = r.h - Cut;
	}
}